

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Builder __thiscall
capnp::_::PointerBuilder::initBlob<capnp::Data>(PointerBuilder *this,ByteCount size)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  word *result;
  WirePointer *pWVar1;
  WirePointer *pWVar2;
  uint uVar3;
  AllocateResult AVar4;
  Builder BVar5;
  ThrowOverflow local_32;
  anon_class_1_0_00000001 local_31;
  
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  if (0x1fffffff < size) {
    kj::ThrowOverflow::operator()(&local_32);
  }
  uVar3 = size + 7 >> 3;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  pWVar1 = (WirePointer *)segment->pos;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar1)) >> 3 <
       (long)(ulong)uVar3) ||
     (segment->pos = (word *)(pWVar1 + uVar3), pWVar1 == (WirePointer *)0x0)) {
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    if (uVar3 == 0x1fffffff) {
      WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_31);
    }
    AVar4 = BuilderArena::allocate(this_00,uVar3 + 1);
    pWVar2 = (WirePointer *)AVar4.words;
    (ref->offsetAndKind).value =
         (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar4.segment)->super_SegmentReader).id.value;
    (pWVar2->offsetAndKind).value = 1;
    pWVar1 = pWVar2 + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar1 - (long)ref) >> 1) & 0xfffffffc) - 3;
    pWVar2 = ref;
  }
  (pWVar2->field_1).upper32Bits = size * 8 + 2;
  BVar5.super_ArrayPtr<unsigned_char>.size_._0_4_ = size;
  BVar5.super_ArrayPtr<unsigned_char>.ptr = (uchar *)pWVar1;
  BVar5.super_ArrayPtr<unsigned_char>.size_._4_4_ = 0;
  return (Builder)BVar5.super_ArrayPtr<unsigned_char>;
}

Assistant:

Data::Builder PointerBuilder::initBlob<Data>(ByteCount size) {
  return WireHelpers::initDataPointer(pointer, segment, capTable,
      assertMaxBits<BLOB_SIZE_BITS>(size, ThrowOverflow())).value;
}